

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

void __thiscall
StackArgWithFormalsTracker::SetStackSymInFormalsIndexMap
          (StackArgWithFormalsTracker *this,StackSym *sym,ArgSlot formalsIndex,ArgSlot formalsCount)

{
  JitArenaAllocator *this_00;
  code *pcVar1;
  ulong uVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  StackSym **__s;
  size_t requestedBytes;
  
  if (this->formalsIndexToStackSymMap == (StackSym **)0x0) {
    if (formalsCount == 0) {
      __s = (StackSym **)&DAT_00000008;
    }
    else {
      this_00 = this->alloc;
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_0043046d;
        *puVar5 = 0;
      }
      uVar2 = (ulong)formalsCount;
      requestedBytes = uVar2 * 8;
      __s = (StackSym **)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          this_00,requestedBytes);
      memset(__s,0,requestedBytes);
      memset(__s + uVar2,0,(ulong)((int)requestedBytes + 0xfU & 0xfffffff0) + uVar2 * -8);
      if (__s == (StackSym **)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_0043046d;
        *puVar5 = 0;
      }
    }
    this->formalsIndexToStackSymMap = __s;
  }
  if (formalsCount <= formalsIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x760,"(formalsIndex < formalsCount)","Out of range ?");
    if (!bVar3) {
LAB_0043046d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  this->formalsIndexToStackSymMap[formalsIndex] = sym;
  return;
}

Assistant:

void
StackArgWithFormalsTracker::SetStackSymInFormalsIndexMap(StackSym * sym, Js::ArgSlot formalsIndex, Js::ArgSlot formalsCount)
{
    if(formalsIndexToStackSymMap == nullptr)
    {
        formalsIndexToStackSymMap = JitAnewArrayZ(alloc, StackSym*, formalsCount);
    }
    AssertMsg(formalsIndex < formalsCount, "Out of range ?");
    formalsIndexToStackSymMap[formalsIndex] = sym;
}